

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::visitMemoryFill(OptimizeInstructions *this,MemoryFill *curr)

{
  bool bVar1;
  Module *pMVar2;
  Expression *rep;
  Expression *ret;
  MemoryFill *local_18;
  MemoryFill *curr_local;
  OptimizeInstructions *this_local;
  
  ret._4_4_ = 1;
  local_18 = curr;
  curr_local = (MemoryFill *)this;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)39>).super_Expression.
                      type,(BasicType *)((long)&ret + 4));
  if (!bVar1) {
    pMVar2 = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
    bVar1 = FeatureSet::hasBulkMemory(&pMVar2->features);
    if (!bVar1) {
      __assert_fail("getModule()->features.hasBulkMemory()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp"
                    ,0x504,"void wasm::OptimizeInstructions::visitMemoryFill(MemoryFill *)");
    }
    rep = optimizeMemoryFill(this,local_18);
    if (rep != (Expression *)0x0) {
      replaceCurrent(this,rep);
    }
  }
  return;
}

Assistant:

void visitMemoryFill(MemoryFill* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    assert(getModule()->features.hasBulkMemory());
    if (auto* ret = optimizeMemoryFill(curr)) {
      return replaceCurrent(ret);
    }
  }